

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O1

void nn_fsm_event_term(nn_fsm_event *self)

{
  return;
}

Assistant:

void nn_fsm_event_term (NN_UNUSED struct nn_fsm_event *self)
{
    /*  We don't term the queue item, although one might think we ought to.
        It turns out that there are some hairy recursions which can cause
        events to get submitted to queues even after the FSM is stopped.
        We could spend more effort fixing this, and perhaps we ought to.
        But given that the assertion itself is harmless, if an FSM event
        is orphaned it should be pretty harmless -- the event won't be
        processed but the FSM is shutting down anyway.  So skip it for now.
        Later, if we don't rewrite/gut the entire FSM machinery, we can
        revisit this. */
    /* nn_queue_item_term (&self->item); */
}